

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O2

aiNodeAnim * __thiscall
Assimp::FBX::FBXConverter::GenerateSimpleNodeAnim
          (FBXConverter *this,string *name,Model *target,const_iterator *chain,
          const_iterator iter_end,LayerMap *layer_map,int64_t start,int64_t stop,double *max_time,
          double *min_time,bool reverse_order)

{
  _Base_ptr p_Var1;
  undefined1 auVar2 [16];
  unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_> uVar3;
  pointer plVar4;
  aiNodeAnim *paVar5;
  RotOrder RVar6;
  undefined4 uVar7;
  __uniq_ptr_data<aiNodeAnim,_std::default_delete<aiNodeAnim>,_true,_true> na_00;
  PropertyTable *in;
  aiQuatKey *out_quat;
  aiVectorKey *paVar8;
  aiVectorKey *out_translation;
  undefined8 *puVar9;
  pointer ppaVar10;
  _Head_base<0UL,_aiNodeAnim_*,_false> _Var11;
  aiQuatKey *paVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  FBXConverter *pFVar16;
  pointer ppaVar17;
  aiVector3t<float> aVar18;
  aiQuaternion aVar19;
  unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_> na;
  KeyFrameListList scaling;
  KeyFrameListList translation;
  KeyFrameListList rotation;
  KeyFrameListList joined;
  _Vector_base<long,_std::allocator<long>_> local_78;
  _Base_ptr local_60;
  float local_58;
  _Base_ptr local_50;
  float local_48;
  pointer local_40;
  float local_38;
  
  _Var11._M_head_impl = (aiNodeAnim *)chain;
  na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
  super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
  super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl =
       (__uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>)operator_new(0x438);
  *(undefined4 *)
   na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
   super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
   super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl = 0;
  *(char *)((long)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
                  super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                  super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 4) = '\0';
  memset((char *)((long)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>.
                        _M_t.super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                        super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 5),0x1b,0x3ff);
  *(aiQuatKey **)
   ((long)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
          super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
          super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x418) = (aiQuatKey *)0x0;
  *(uint *)((long)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
                  super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                  super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x420) = 0;
  *(undefined8 *)
   ((long)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
          super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
          super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x404) = 0;
  *(undefined8 *)
   ((long)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
          super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
          super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x40c) = 0;
  *(aiVectorKey **)
   ((long)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
          super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
          super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x428) = (aiVectorKey *)0x0;
  *(undefined8 *)
   ((long)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
          super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
          super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x430) = 0;
  uVar15 = name->_M_string_length;
  na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
  super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
  super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl =
       (__uniq_ptr_data<aiNodeAnim,_std::default_delete<aiNodeAnim>,_true,_true>)
       (__uniq_ptr_data<aiNodeAnim,_std::default_delete<aiNodeAnim>,_true,_true>)
       na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
       super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
       super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl;
  if (uVar15 < 0x400) {
    *(int *)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
            super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
            super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl = (int)uVar15;
    memcpy((char *)((long)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                          super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 4),
           (name->_M_dataplus)._M_p,uVar15);
    ((char *)((long)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
                    super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                    super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 4))[uVar15] = '\0';
  }
  in = Model::Props(target);
  if (reverse_order) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&scaling,"Lcl Scaling",(allocator<char> *)&rotation);
    translation.
    super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3f8000003f800000;
    translation.
    super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)CONCAT44(translation.
                           super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish._4_4_,0x3f800000);
    aVar18 = PropertyGet<aiVector3t<float>>(in,(string *)&scaling,(aiVector3t<float> *)&translation)
    ;
    local_38 = aVar18.z;
    local_40 = aVar18._0_8_;
    std::__cxx11::string::~string((string *)&scaling);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&scaling,"Lcl Translation",(allocator<char> *)&rotation);
    translation.
    super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    translation.
    super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)((ulong)translation.
                          super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
    aVar18 = PropertyGet<aiVector3t<float>>(in,(string *)&scaling,(aiVector3t<float> *)&translation)
    ;
    local_48 = aVar18.z;
    local_50 = aVar18._0_8_;
    std::__cxx11::string::~string((string *)&scaling);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&scaling,"Lcl Rotation",(allocator<char> *)&rotation);
    translation.
    super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    translation.
    super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)((ulong)translation.
                          super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
    pFVar16 = (FBXConverter *)&scaling;
    aVar18 = PropertyGet<aiVector3t<float>>(in,(string *)pFVar16,(aiVector3t<float> *)&translation);
    local_58 = aVar18.z;
    local_60 = aVar18._0_8_;
    std::__cxx11::string::~string((string *)&scaling);
    scaling.
    super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    translation.
    super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    scaling.
    super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    scaling.
    super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    rotation.
    super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    translation.
    super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    translation.
    super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    rotation.
    super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    rotation.
    super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (chain[0xc]._M_node != iter_end._M_node) {
      GetKeyframeList(&joined,pFVar16,
                      (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                       *)(chain[0xc]._M_node + 2),start,stop);
      pFVar16 = (FBXConverter *)&joined;
      std::
      vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ::_M_move_assign(&scaling);
      std::
      vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ::~vector((vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                 *)&joined);
    }
    if (chain[3]._M_node != iter_end._M_node) {
      GetKeyframeList(&joined,pFVar16,
                      (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                       *)(chain[3]._M_node + 2),start,stop);
      pFVar16 = (FBXConverter *)&joined;
      std::
      vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ::_M_move_assign(&translation);
      std::
      vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ::~vector((vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                 *)&joined);
    }
    if (chain[7]._M_node != iter_end._M_node) {
      GetKeyframeList(&joined,pFVar16,
                      (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                       *)(chain[7]._M_node + 2),start,stop);
      std::
      vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ::_M_move_assign(&rotation);
      std::
      vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ::~vector(&joined);
    }
    joined.
    super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    joined.
    super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    joined.
    super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>,std::allocator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>>
    ::
    insert<__gnu_cxx::__normal_iterator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>*,std::vector<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>,std::allocator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>>>,void>
              ((vector<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>,std::allocator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>>
                *)&joined,(const_iterator)0x0,
               (__normal_iterator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_*,_std::vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>_>
                )scaling.
                 super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_*,_std::vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>_>
                )scaling.
                 super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    std::
    vector<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>,std::allocator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>>
    ::
    insert<__gnu_cxx::__normal_iterator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>*,std::vector<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>,std::allocator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>>>,void>
              ((vector<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>,std::allocator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>>
                *)&joined,
               (const_iterator)
               joined.
               super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (__normal_iterator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_*,_std::vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>_>
                )translation.
                 super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_*,_std::vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>_>
                )translation.
                 super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    pFVar16 = (FBXConverter *)
              joined.
              super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    std::
    vector<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>,std::allocator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>>
    ::
    insert<__gnu_cxx::__normal_iterator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>*,std::vector<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>,std::allocator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>>>,void>
              ((vector<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>,std::allocator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>>
                *)&joined,
               (const_iterator)
               joined.
               super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (__normal_iterator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_*,_std::vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>_>
                )rotation.
                 super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_*,_std::vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>_>
                )rotation.
                 super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    GetKeyTimeList((KeyTimeList *)&local_78,pFVar16,&joined);
    ppaVar10 = (pointer)local_78._M_impl.super__Vector_impl_data._M_finish;
    plVar4 = local_78._M_impl.super__Vector_impl_data._M_start;
    uVar14 = (long)local_78._M_impl.super__Vector_impl_data._M_finish -
             (long)local_78._M_impl.super__Vector_impl_data._M_start >> 3;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar14;
    uVar15 = 0xffffffffffffffff;
    if (SUB168(auVar2 * ZEXT816(0x18),8) == 0) {
      uVar15 = SUB168(auVar2 * ZEXT816(0x18),0);
    }
    out_quat = (aiQuatKey *)operator_new__(uVar15);
    if (ppaVar10 != (pointer)plVar4) {
      paVar12 = out_quat;
      do {
        paVar12->mTime = 0.0;
        (paVar12->mValue).w = 1.0;
        (paVar12->mValue).x = 0.0;
        (paVar12->mValue).y = 0.0;
        (paVar12->mValue).z = 0.0;
        paVar12 = paVar12 + 1;
      } while (paVar12 != out_quat + uVar14);
    }
    paVar8 = (aiVectorKey *)operator_new__(uVar15);
    if (ppaVar10 != (pointer)plVar4) {
      lVar13 = 0;
      do {
        *(undefined4 *)((long)&(paVar8->mValue).z + lVar13) = 0;
        puVar9 = (undefined8 *)((long)&paVar8->mTime + lVar13);
        *puVar9 = 0;
        puVar9[1] = 0;
        lVar13 = lVar13 + 0x18;
      } while (uVar14 * 0x18 - lVar13 != 0);
    }
    out_translation = (aiVectorKey *)operator_new__(uVar15);
    ppaVar17 = ppaVar10;
    if (ppaVar10 != (pointer)plVar4) {
      lVar13 = 0;
      do {
        *(undefined4 *)((long)&(out_translation->mValue).z + lVar13) = 0;
        puVar9 = (undefined8 *)((long)&out_translation->mTime + lVar13);
        *puVar9 = 0;
        puVar9[1] = 0;
        lVar13 = lVar13 + 0x18;
      } while (uVar14 * 0x18 - lVar13 != 0);
      RVar6 = Model::RotationOrder(target);
      ConvertTransformOrder_TRStoSRT
                (this,out_quat,paVar8,out_translation,&scaling,&translation,&rotation,
                 (KeyTimeList *)&local_78,max_time,min_time,RVar6,(aiVector3D *)&local_40,
                 (aiVector3D *)&local_50,(aiVector3D *)&local_60);
      ppaVar10 = (pointer)local_78._M_impl.super__Vector_impl_data._M_finish;
      ppaVar17 = (pointer)local_78._M_impl.super__Vector_impl_data._M_start;
    }
    uVar7 = (undefined4)((ulong)((long)ppaVar10 - (long)ppaVar17) >> 3);
    *(undefined4 *)
     ((long)na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
            super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
            super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x420) = uVar7;
    *(undefined4 *)
     ((long)na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
            super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
            super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x410) = uVar7;
    *(undefined4 *)
     ((long)na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
            super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
            super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x404) = uVar7;
    *(aiVectorKey **)
     ((long)na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
            super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
            super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x428) = paVar8;
    *(aiQuatKey **)
     ((long)na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
            super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
            super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x418) = out_quat;
    *(aiVectorKey **)
     ((long)na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
            super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
            super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x408) = out_translation;
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_78);
    std::
    vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ::~vector(&joined);
    std::
    vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ::~vector(&rotation);
    std::
    vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ::~vector(&translation);
    std::
    vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ::~vector(&scaling);
  }
  else {
    if (chain[0xc]._M_node == iter_end._M_node) {
      paVar8 = (aiVectorKey *)operator_new__(0x18);
      (paVar8->mValue).z = 0.0;
      (paVar8->mValue).x = 0.0;
      (paVar8->mValue).y = 0.0;
      *(aiVectorKey **)
       ((long)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
              super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
              super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x428) = paVar8;
      *(uint *)((long)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t
                      .super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                      super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x420) = 1;
      paVar8->mTime = 0.0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&scaling,"Lcl Scaling",(allocator<char> *)&rotation);
      translation.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3f8000003f800000;
      translation.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)CONCAT44(translation.
                             super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish._4_4_,0x3f800000);
      aVar18 = PropertyGet<aiVector3t<float>>
                         (in,(string *)&scaling,(aiVector3t<float> *)&translation);
      lVar13 = *(long *)((long)na._M_t.
                               super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>.
                               _M_t.
                               super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>
                               .super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x428);
      *(long *)(lVar13 + 8) = aVar18._0_8_;
      *(float *)(lVar13 + 0x10) = aVar18.z;
      std::__cxx11::string::~string((string *)&scaling);
    }
    else {
      paVar5 = (aiNodeAnim *)min_time;
      ConvertScaleKeys(this,(aiNodeAnim *)
                            na_00.
                            super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t
                            .super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                            super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl,
                       (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                        *)(chain[0xc]._M_node + 2),(LayerMap *)_Var11._M_head_impl,start,stop,
                       max_time,min_time);
      _Var11._M_head_impl = paVar5;
    }
    uVar3._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
    super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
    super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl =
         na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
         super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
         super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl;
    p_Var1 = chain[7]._M_node;
    if (p_Var1 == iter_end._M_node) {
      puVar9 = (undefined8 *)operator_new__(0x18);
      puVar9[1] = 0x3f800000;
      puVar9[2] = 0;
      *(undefined8 **)
       ((long)na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
              super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
              super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x418) = puVar9;
      *(undefined4 *)
       ((long)na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
              super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
              super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x410) = 1;
      *puVar9 = 0;
      _Var11._M_head_impl = (aiNodeAnim *)na;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&scaling,"Lcl Rotation",(allocator<char> *)&joined);
      rotation.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      rotation.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)((ulong)rotation.
                            super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish._4_4_ << 0x20);
      aVar18 = PropertyGet<aiVector3t<float>>(in,(string *)&scaling,(aiVector3t<float> *)&rotation);
      translation.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = aVar18._0_8_;
      translation.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)CONCAT44(translation.
                             super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish._4_4_,aVar18.z);
      RVar6 = Model::RotationOrder(target);
      aVar19 = EulerToQuaternion((FBXConverter *)target,(aiVector3D *)&translation,RVar6);
      *(aiQuaternion *)
       (*(long *)((long)na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>.
                        _M_t.super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                        super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x418) + 8) =
           aVar19;
      std::__cxx11::string::~string((string *)&scaling);
    }
    else {
      RVar6 = Model::RotationOrder(target);
      ConvertRotationKeys(this,(aiNodeAnim *)
                               uVar3._M_t.
                               super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>.
                               _M_t.
                               super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>
                               .super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl,
                          (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                           *)(p_Var1 + 2),(LayerMap *)_Var11._M_head_impl,start,stop,max_time,
                          min_time,RVar6);
    }
    if (chain[3]._M_node == iter_end._M_node) {
      puVar9 = (undefined8 *)operator_new__(0x18);
      *(undefined4 *)(puVar9 + 2) = 0;
      puVar9[1] = 0;
      *(undefined8 **)
       ((long)na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
              super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
              super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x408) = puVar9;
      *(undefined4 *)
       ((long)na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
              super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
              super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x404) = 1;
      *puVar9 = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&scaling,"Lcl Translation",(allocator<char> *)&rotation);
      translation.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      translation.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)((ulong)translation.
                            super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
      aVar18 = PropertyGet<aiVector3t<float>>
                         (in,(string *)&scaling,(aiVector3t<float> *)&translation);
      lVar13 = *(long *)((long)na._M_t.
                               super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>.
                               _M_t.
                               super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>
                               .super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x408);
      *(long *)(lVar13 + 8) = aVar18._0_8_;
      *(float *)(lVar13 + 0x10) = aVar18.z;
      std::__cxx11::string::~string((string *)&scaling);
    }
    else {
      ConvertTranslationKeys
                (this,(aiNodeAnim *)
                      na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>.
                      _M_t.super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                      super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl,
                 (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                  *)(chain[3]._M_node + 2),(LayerMap *)_Var11._M_head_impl,start,stop,max_time,
                 min_time);
    }
  }
  uVar3._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
  super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
  super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl =
       na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
       super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
       super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl;
  na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
  super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
  super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl =
       (__uniq_ptr_data<aiNodeAnim,_std::default_delete<aiNodeAnim>,_true,_true>)
       (__uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>)0x0;
  std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::~unique_ptr(&na);
  return (aiNodeAnim *)
         (__uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>)
         uVar3._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
         super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
         super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl;
}

Assistant:

aiNodeAnim* FBXConverter::GenerateSimpleNodeAnim(const std::string& name,
            const Model& target,
            NodeMap::const_iterator chain[TransformationComp_MAXIMUM],
            NodeMap::const_iterator iter_end,
            const LayerMap& layer_map,
            int64_t start, int64_t stop,
            double& max_time,
            double& min_time,
            bool reverse_order)

        {
            std::unique_ptr<aiNodeAnim> na(new aiNodeAnim());
            na->mNodeName.Set(name);

            const PropertyTable& props = target.Props();

            // need to convert from TRS order to SRT?
            if (reverse_order) {

                aiVector3D def_scale = PropertyGet(props, "Lcl Scaling", aiVector3D(1.f, 1.f, 1.f));
                aiVector3D def_translate = PropertyGet(props, "Lcl Translation", aiVector3D(0.f, 0.f, 0.f));
                aiVector3D def_rot = PropertyGet(props, "Lcl Rotation", aiVector3D(0.f, 0.f, 0.f));

                KeyFrameListList scaling;
                KeyFrameListList translation;
                KeyFrameListList rotation;

                if (chain[TransformationComp_Scaling] != iter_end) {
                    scaling = GetKeyframeList((*chain[TransformationComp_Scaling]).second, start, stop);
                }

                if (chain[TransformationComp_Translation] != iter_end) {
                    translation = GetKeyframeList((*chain[TransformationComp_Translation]).second, start, stop);
                }

                if (chain[TransformationComp_Rotation] != iter_end) {
                    rotation = GetKeyframeList((*chain[TransformationComp_Rotation]).second, start, stop);
                }

                KeyFrameListList joined;
                joined.insert(joined.end(), scaling.begin(), scaling.end());
                joined.insert(joined.end(), translation.begin(), translation.end());
                joined.insert(joined.end(), rotation.begin(), rotation.end());

                const KeyTimeList& times = GetKeyTimeList(joined);

                aiQuatKey* out_quat = new aiQuatKey[times.size()];
                aiVectorKey* out_scale = new aiVectorKey[times.size()];
                aiVectorKey* out_translation = new aiVectorKey[times.size()];

                if (times.size())
                {
                    ConvertTransformOrder_TRStoSRT(out_quat, out_scale, out_translation,
                        scaling,
                        translation,
                        rotation,
                        times,
                        max_time,
                        min_time,
                        target.RotationOrder(),
                        def_scale,
                        def_translate,
                        def_rot);
                }

                // XXX remove duplicates / redundant keys which this operation did
                // likely produce if not all three channels were equally dense.

                na->mNumScalingKeys = static_cast<unsigned int>(times.size());
                na->mNumRotationKeys = na->mNumScalingKeys;
                na->mNumPositionKeys = na->mNumScalingKeys;

                na->mScalingKeys = out_scale;
                na->mRotationKeys = out_quat;
                na->mPositionKeys = out_translation;
            }
            else {

                // if a particular transformation is not given, grab it from
                // the corresponding node to meet the semantics of aiNodeAnim,
                // which requires all of rotation, scaling and translation
                // to be set.
                if (chain[TransformationComp_Scaling] != iter_end) {
                    ConvertScaleKeys(na.get(), (*chain[TransformationComp_Scaling]).second,
                        layer_map,
                        start, stop,
                        max_time,
                        min_time);
                }
                else {
                    na->mScalingKeys = new aiVectorKey[1];
                    na->mNumScalingKeys = 1;

                    na->mScalingKeys[0].mTime = 0.;
                    na->mScalingKeys[0].mValue = PropertyGet(props, "Lcl Scaling",
                        aiVector3D(1.f, 1.f, 1.f));
                }

                if (chain[TransformationComp_Rotation] != iter_end) {
                    ConvertRotationKeys(na.get(), (*chain[TransformationComp_Rotation]).second,
                        layer_map,
                        start, stop,
                        max_time,
                        min_time,
                        target.RotationOrder());
                }
                else {
                    na->mRotationKeys = new aiQuatKey[1];
                    na->mNumRotationKeys = 1;

                    na->mRotationKeys[0].mTime = 0.;
                    na->mRotationKeys[0].mValue = EulerToQuaternion(
                        PropertyGet(props, "Lcl Rotation", aiVector3D(0.f, 0.f, 0.f)),
                        target.RotationOrder());
                }

                if (chain[TransformationComp_Translation] != iter_end) {
                    ConvertTranslationKeys(na.get(), (*chain[TransformationComp_Translation]).second,
                        layer_map,
                        start, stop,
                        max_time,
                        min_time);
                }
                else {
                    na->mPositionKeys = new aiVectorKey[1];
                    na->mNumPositionKeys = 1;

                    na->mPositionKeys[0].mTime = 0.;
                    na->mPositionKeys[0].mValue = PropertyGet(props, "Lcl Translation",
                        aiVector3D(0.f, 0.f, 0.f));
                }

            }
            return na.release();
        }